

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O3

int pt_insn_process_overflow(pt_insn_decoder *decoder)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  
  bVar1 = (decoder->event).field_0x4;
  iVar3 = -6;
  if ((bVar1 & 2) == 0) {
    if ((bVar1 & 1) == 0) {
      decoder->ip = (decoder->event).variant.enabled.ip;
      uVar2 = (ushort)*(undefined4 *)&decoder->field_0xb00 | 1;
    }
    else {
      uVar2 = *(ushort *)&decoder->field_0xb00 & 0xfffe;
      decoder->ip = 0;
    }
    *(ushort *)&decoder->field_0xb00 = uVar2 & 0xfffb;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int pt_insn_process_overflow(struct pt_insn_decoder *decoder)
{
	struct pt_event *ev;

	if (!decoder)
		return -pte_internal;

	ev = &decoder->event;

	/* This event can't be a status update. */
	if (ev->status_update)
		return -pte_bad_context;

	/* If the IP is suppressed, the overflow resolved while tracing was
	 * disabled.  Otherwise it resolved while tracing was enabled.
	 */
	if (ev->ip_suppressed) {
		/* Tracing is disabled.
		 *
		 * It doesn't make sense to preserve the previous IP.  This will
		 * just be misleading.  Even if tracing had been disabled
		 * before, as well, we might have missed the re-enable in the
		 * overflow.
		 */
		decoder->enabled = 0;
		decoder->ip = 0ull;
	} else {
		/* Tracing is enabled and we're at the IP at which the overflow
		 * resolved.
		 */
		decoder->ip = ev->variant.overflow.ip;
		decoder->enabled = 1;
	}

	/* We don't know the TSX state.  Let's assume we execute normally.
	 *
	 * We also don't know the execution mode.  Let's keep what we have
	 * in case we don't get an update before we have to decode the next
	 * instruction.
	 */
	decoder->speculative = 0;

	return 0;
}